

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

size_t roaring64_bitmap_portable_deserialize_size(char *buf,size_t maxbytes)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  
  if ((maxbytes < 8 || buf == (char *)0x0) || (uVar2 = *(ulong *)buf, uVar2 >> 0x20 != 0)) {
LAB_00108b3f:
    sVar4 = 0;
  }
  else if (uVar2 == 0) {
    sVar4 = 8;
  }
  else {
    pcVar3 = buf + 8;
    sVar4 = 8;
    do {
      uVar5 = sVar4 + 4;
      if (maxbytes < uVar5) goto LAB_00108b3f;
      sVar1 = roaring_bitmap_portable_deserialize_size(pcVar3 + 4,maxbytes - uVar5);
      if (sVar1 == 0) goto LAB_00108b3f;
      sVar4 = uVar5 + sVar1;
      pcVar3 = pcVar3 + 4 + sVar1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return sVar4;
}

Assistant:

size_t roaring64_bitmap_portable_deserialize_size(const char *buf,
                                                  size_t maxbytes) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    if (buf == NULL) {
        return 0;
    }
    size_t read_bytes = 0;

    // Read as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t buckets;
    if (read_bytes + sizeof(buckets) > maxbytes) {
        return 0;
    }
    memcpy(&buckets, buf, sizeof(buckets));
    buf += sizeof(buckets);
    read_bytes += sizeof(buckets);

    // Buckets should be 32 bits with 4 bits of zero padding.
    if (buckets > UINT32_MAX) {
        return 0;
    }

    // Iterate through buckets ordered by increasing keys.
    for (uint64_t bucket = 0; bucket < buckets; ++bucket) {
        // Read as uint32 the most significant 32 bits of the bucket.
        uint32_t high32;
        if (read_bytes + sizeof(high32) > maxbytes) {
            return 0;
        }
        buf += sizeof(high32);
        read_bytes += sizeof(high32);

        // Read the 32-bit Roaring bitmaps representing the least significant
        // bits of a set of elements.
        size_t bitmap32_size = roaring_bitmap_portable_deserialize_size(
            buf, maxbytes - read_bytes);
        if (bitmap32_size == 0) {
            return 0;
        }
        buf += bitmap32_size;
        read_bytes += bitmap32_size;
    }
    return read_bytes;
}